

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O2

void __thiscall
slang::ast::ASTSerializer::writeLink(ASTSerializer *this,string_view name,Symbol *value)

{
  bool bVar1;
  string_view value_00;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  JsonWriter::writeProperty(this->writer,name);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (this->includeAddrs == true) {
    std::__cxx11::to_string(&local_38,(unsigned_long)value);
    std::operator+(&bStack_78,&local_38," ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_58,&bStack_78);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Symbol::isType(value);
  if (bVar1) {
    Type::toString_abi_cxx11_(&bStack_78,(Type *)value);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_58,&bStack_78);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&bStack_78,&value->name,(allocator<char> *)&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_58,&bStack_78);
  }
  std::__cxx11::string::~string((string *)&bStack_78);
  value_00._M_str = local_58._M_dataplus._M_p;
  value_00._M_len = local_58._M_string_length;
  JsonWriter::writeValue(this->writer,value_00);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ASTSerializer::writeLink(std::string_view name, const Symbol& value) {
    writer.writeProperty(name);

    std::string str;
    if (includeAddrs)
        str = std::to_string(uintptr_t(&value)) + " ";

    if (value.isType())
        str += value.as<Type>().toString();
    else
        str += std::string(value.name);

    writer.writeValue(str);
}